

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginChildEx(char *name,ImGuiID id,ImVec2 *size_arg,bool border,ImGuiWindowFlags flags)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  byte in_CL;
  byte bVar4;
  uint in_ESI;
  long in_RDI;
  uint in_R8D;
  float fVar5;
  ImGuiWindow *child_window;
  bool ret;
  float backup_border_size;
  int auto_fit_axises;
  ImVec2 size;
  ImVec2 content_avail;
  ImGuiWindow *parent_window;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_000003c4;
  bool *in_stack_000003c8;
  char *in_stack_000003d0;
  ImVec2 *in_stack_ffffffffffffffa8;
  ImGuiWindow *window;
  ImVec2 local_40;
  float local_38;
  ImGuiWindow *window_00;
  
  pIVar2 = GImGui;
  window_00 = GImGui->CurrentWindow;
  _local_38 = GetContentRegionAvail();
  local_40 = ImFloor(in_stack_ffffffffffffffa8);
  bVar1 = local_40.x == 0.0;
  bVar4 = 0;
  if (local_40.y == 0.0) {
    bVar4 = 2;
  }
  if (local_40.x <= 0.0) {
    fVar5 = ImMax<float>(local_38 + local_40.x,4.0);
    local_40.x = fVar5;
  }
  if (local_40.y <= 0.0) {
    fVar5 = ImMax<float>(local_38._4_4_ + local_40.y,4.0);
    local_40.y = fVar5;
  }
  SetNextWindowSize(&local_40,0);
  if (in_RDI == 0) {
    ImFormatString(pIVar2->TempBuffer,0xc01,"%s/%08X",window_00->Name,(ulong)in_ESI);
  }
  else {
    ImFormatString(pIVar2->TempBuffer,0xc01,"%s/%s_%08X",window_00->Name,in_RDI,(ulong)in_ESI);
  }
  fVar5 = (pIVar2->Style).ChildBorderSize;
  if ((in_CL & 1) == 0) {
    (pIVar2->Style).ChildBorderSize = 0.0;
  }
  bVar3 = Begin(in_stack_000003d0,in_stack_000003c8,in_stack_000003c4);
  (pIVar2->Style).ChildBorderSize = fVar5;
  window = pIVar2->CurrentWindow;
  window->ChildId = in_ESI;
  window->AutoFitChildAxises = bVar1 | bVar4;
  if (window->BeginCount == 1) {
    (window_00->DC).CursorPos = window->Pos;
  }
  if (((pIVar2->NavActivateId == in_ESI) && ((in_R8D & 0x800000) == 0)) &&
     (((window->DC).NavLayerActiveMask != 0 || (((window->DC).NavHasScroll & 1U) != 0)))) {
    FocusWindow(window_00);
    NavInitWindow(window_00,local_38._7_1_);
    SetActiveID(in_ESI + 1,window);
    pIVar2->ActiveIdSource = ImGuiInputSource_Nav;
  }
  return bVar3;
}

Assistant:

bool ImGui::BeginChildEx(const char* name, ImGuiID id, const ImVec2& size_arg, bool border, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;

    flags |= ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_ChildWindow;
    flags |= (parent_window->Flags & ImGuiWindowFlags_NoMove);  // Inherit the NoMove flag

    // Size
    const ImVec2 content_avail = GetContentRegionAvail();
    ImVec2 size = ImFloor(size_arg);
    const int auto_fit_axises = ((size.x == 0.0f) ? (1 << ImGuiAxis_X) : 0x00) | ((size.y == 0.0f) ? (1 << ImGuiAxis_Y) : 0x00);
    if (size.x <= 0.0f)
        size.x = ImMax(content_avail.x + size.x, 4.0f); // Arbitrary minimum child size (0.0f causing too much issues)
    if (size.y <= 0.0f)
        size.y = ImMax(content_avail.y + size.y, 4.0f);
    SetNextWindowSize(size);

    // Build up name. If you need to append to a same child from multiple location in the ID stack, use BeginChild(ImGuiID id) with a stable value.
    if (name)
        ImFormatString(g.TempBuffer, IM_ARRAYSIZE(g.TempBuffer), "%s/%s_%08X", parent_window->Name, name, id);
    else
        ImFormatString(g.TempBuffer, IM_ARRAYSIZE(g.TempBuffer), "%s/%08X", parent_window->Name, id);

    const float backup_border_size = g.Style.ChildBorderSize;
    if (!border)
        g.Style.ChildBorderSize = 0.0f;
    bool ret = Begin(g.TempBuffer, NULL, flags);
    g.Style.ChildBorderSize = backup_border_size;

    ImGuiWindow* child_window = g.CurrentWindow;
    child_window->ChildId = id;
    child_window->AutoFitChildAxises = (ImS8)auto_fit_axises;

    // Set the cursor to handle case where the user called SetNextWindowPos()+BeginChild() manually.
    // While this is not really documented/defined, it seems that the expected thing to do.
    if (child_window->BeginCount == 1)
        parent_window->DC.CursorPos = child_window->Pos;

    // Process navigation-in immediately so NavInit can run on first frame
    if (g.NavActivateId == id && !(flags & ImGuiWindowFlags_NavFlattened) && (child_window->DC.NavLayerActiveMask != 0 || child_window->DC.NavHasScroll))
    {
        FocusWindow(child_window);
        NavInitWindow(child_window, false);
        SetActiveID(id + 1, child_window); // Steal ActiveId with another arbitrary id so that key-press won't activate child item
        g.ActiveIdSource = ImGuiInputSource_Nav;
    }
    return ret;
}